

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.cc
# Opt level: O0

void __thiscall
CcTest::CcTest(CcTest *this,TestFunction *callback,char *test_file,char *test_name,
              char *test_dependency,bool test_is_enabled)

{
  char *pcVar1;
  char *in_RCX;
  char *in_RDX;
  TestFunction *in_RSI;
  CcTest *in_RDI;
  char *in_R8;
  byte in_R9B;
  char *extension;
  char *basename;
  char *local_38;
  
  in_RDI->callback_ = in_RSI;
  in_RDI->name_ = in_RCX;
  in_RDI->dependency_ = in_R8;
  in_RDI->prev_ = last_;
  local_38 = strrchr(in_RDX,0x2f);
  if (local_38 == (char *)0x0) {
    local_38 = strrchr(in_RDX,0x5c);
  }
  if (local_38 == (char *)0x0) {
    local_38 = strdup(in_RDX);
  }
  else {
    local_38 = strdup(local_38 + 1);
  }
  pcVar1 = strrchr(local_38,0x2e);
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
  }
  in_RDI->file_ = local_38;
  in_RDI->enabled_ = (bool)(in_R9B & 1);
  in_RDI->prev_ = last_;
  last_ = in_RDI;
  return;
}

Assistant:

CcTest::CcTest(TestFunction* callback, const char* test_file,
               const char* test_name, const char* test_dependency,
               bool test_is_enabled)
    : callback_(callback), name_(test_name), dependency_(test_dependency),
      prev_(last_) {
  // Find the base name of this test (const_cast required on Windows).
  char *basename = strrchr(const_cast<char *>(test_file), '/');
  if (!basename) {
    basename = strrchr(const_cast<char *>(test_file), '\\');
  }
  if (!basename) {
    basename = strdup(test_file);
  } else {
    basename = strdup(basename + 1);
  }
  // Drop the extension, if there is one.
  char *extension = strrchr(basename, '.');
  if (extension) *extension = 0;
  // Install this test in the list of tests
  file_ = basename;
  enabled_ = test_is_enabled;
  prev_ = last_;
  last_ = this;
}